

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_validate(lyd_node **node,int options,void *var_arg,...)

{
  char in_AL;
  int iVar1;
  ly_ctx *in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [24];
  ly_ctx *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined4 local_68;
  undefined4 local_64;
  va_list ap;
  ly_ctx *local_48;
  ly_ctx *ctx;
  lyd_difflist **diff;
  lyd_node *data_tree;
  lyd_node *iter;
  void *var_arg_local;
  int options_local;
  lyd_node **node_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  ctx = (ly_ctx *)0x0;
  local_48 = (ly_ctx *)0x0;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (node == (lyd_node **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate");
    node_local._4_4_ = 1;
  }
  else {
    iVar1 = lyp_data_check_options((ly_ctx *)0x0,options,"lyd_validate");
    if (iVar1 == 0) {
      diff = (lyd_difflist **)*node;
      if ((((options & 0x10000ffU) == 0) || ((options & 0xfU) != 0)) && (*node == (lyd_node *)0x0))
      {
        if (var_arg == (void *)0x0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                 "%s: invalid variable parameter (struct ly_ctx *ctx).","lyd_validate");
          return 1;
        }
        var_arg_local._4_4_ = options & 0xffffefff;
        local_48 = (ly_ctx *)var_arg;
      }
      else {
        var_arg_local._4_4_ = options;
        if ((options & 0x70U) == 0) {
          if ((((options & 0x1000000U) != 0) && (*node != (lyd_node *)0x0)) &&
             (((*node)->prev->next != (lyd_node *)0x0 || ((*node)->next != (lyd_node *)0x0)))) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                   "%s: invalid variable parameter (struct lyd_node *node).","lyd_validate");
            return 1;
          }
        }
        else {
          if ((options & 0x1000U) != 0) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                   "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
                   ,"lyd_validate");
            return 1;
          }
          if (*node == (lyd_node *)0x0) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate");
            return 1;
          }
          diff = (lyd_difflist **)var_arg;
          if (var_arg != (void *)0x0) {
            data_tree = (lyd_node *)var_arg;
            if ((options & 0x8000U) != 0) {
              ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                     "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
                     ,"lyd_validate");
              return 1;
            }
            for (; data_tree != (lyd_node *)0x0; data_tree = data_tree->next) {
              if (data_tree->parent != (lyd_node *)0x0) {
                ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                       "%s: invalid variable parameter (const struct lyd_node *data_tree).",
                       "lyd_validate");
                return 1;
              }
            }
            while (diff[4][1].type != (LYD_DIFFTYPE *)0x0) {
              diff = (lyd_difflist **)diff[4];
            }
          }
        }
      }
      if ((var_arg_local._4_4_ & 0x40000) != 0) {
        ap[0].overflow_arg_area = local_118;
        ap[0]._0_8_ = &stack0x00000008;
        local_64 = 0x30;
        local_68 = 0x20;
        ctx = local_100;
        if (local_100 == (ly_ctx *)0x0) {
          ly_log(local_48,LY_LLERR,LY_EINVAL,
                 "%s: invalid variable parameter (struct lyd_difflist **).","lyd_validate");
          return 1;
        }
      }
      if (*node != (lyd_node *)0x0) {
        if (local_48 == (ly_ctx *)0x0) {
          local_48 = (*node)->schema->module->ctx;
        }
        if ((var_arg_local._4_4_ & 0x1000) == 0) {
          while ((*node)->prev->next != (lyd_node *)0x0) {
            *node = (*node)->prev;
          }
        }
      }
      node_local._4_4_ =
           _lyd_validate(node,(lyd_node *)diff,local_48,(lys_module **)0x0,0,(lyd_difflist **)ctx,
                         var_arg_local._4_4_);
    }
    else {
      node_local._4_4_ = 1;
    }
  }
  return node_local._4_4_;
}

Assistant:

API int
lyd_validate(struct lyd_node **node, int options, void *var_arg, ...)
{
    struct lyd_node *iter, *data_tree = NULL;
    struct lyd_difflist **diff = NULL;
    struct ly_ctx *ctx = NULL;
    va_list ap;

    if (!node) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (lyp_data_check_options(NULL, options, __func__)) {
        return EXIT_FAILURE;
    }

    data_tree = *node;

    if ((!(options & LYD_OPT_TYPEMASK)
            || (options & (LYD_OPT_CONFIG | LYD_OPT_GET | LYD_OPT_GETCONFIG | LYD_OPT_EDIT))) && !(*node)) {
        /* get context with schemas from the var_arg */
        ctx = (struct ly_ctx *)var_arg;
        if (!ctx) {
            LOGERR(NULL, LY_EINVAL, "%s: invalid variable parameter (struct ly_ctx *ctx).", __func__);
            return EXIT_FAILURE;
        }

        /* LYD_OPT_NOSIBLINGS has no meaning here */
        options &= ~LYD_OPT_NOSIBLINGS;
    } else if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
        /* LYD_OPT_NOSIBLINGS cannot be set in this case */
        if (options & LYD_OPT_NOSIBLINGS) {
            LOGERR(NULL, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
            return EXIT_FAILURE;
        } else if (!(*node)) {
            LOGARG;
            return EXIT_FAILURE;
        }

        /* get the additional data tree if given */
        data_tree = (struct lyd_node *)var_arg;
        if (data_tree) {
            if (options & LYD_OPT_NOEXTDEPS) {
                LOGERR(NULL, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set).",
                       __func__);
                return EXIT_FAILURE;
            }

            LY_TREE_FOR(data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(NULL, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    return EXIT_FAILURE;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);
        }
    } else if (options & LYD_OPT_DATA_TEMPLATE) {
        /* get context with schemas from the var_arg */
        if (*node && ((*node)->prev->next || (*node)->next)) {
            /* not allow sibling in top-level */
            LOGERR(NULL, LY_EINVAL, "%s: invalid variable parameter (struct lyd_node *node).", __func__);
            return EXIT_FAILURE;
        }
    }

    if (options & LYD_OPT_VAL_DIFF) {
        va_start(ap, var_arg);
        diff = va_arg(ap, struct lyd_difflist **);
        va_end(ap);
        if (!diff) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (struct lyd_difflist **).", __func__);
            return EXIT_FAILURE;
        }
    }

    if (*node) {
        if (!ctx) {
            ctx = (*node)->schema->module->ctx;
        }
        if (!(options & LYD_OPT_NOSIBLINGS)) {
            /* check that the node is the first sibling */
            while ((*node)->prev->next) {
                *node = (*node)->prev;
            }
        }
    }

    return _lyd_validate(node, data_tree, ctx, NULL, 0, diff, options);
}